

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O0

sexp sexp_make_cpointer(sexp ctx,sexp_uint_t type_id,void *value,sexp parent,int freep)

{
  size_t in_RCX;
  sexp in_RDX;
  undefined4 in_R8D;
  sexp ptr;
  undefined4 in_stack_ffffffffffffffd0;
  sexp local_8;
  
  if (in_RDX == (sexp)0x0) {
    local_8 = (sexp)&DAT_0000003e;
  }
  else {
    local_8 = sexp_alloc_tagged_aux(in_RDX,in_RCX,CONCAT44(in_R8D,in_stack_ffffffffffffffd0));
    if ((((ulong)local_8 & 3) != 0) || (local_8->tag != 0x13)) {
      local_8->field_0x5 = local_8->field_0x5 & 0xfd | ((byte)in_R8D & 1) << 1;
      (local_8->value).type.slots = in_RDX;
      (local_8->value).stack.length = in_RCX;
      (local_8->value).type.cpl = (sexp)0x0;
    }
  }
  return local_8;
}

Assistant:

sexp sexp_make_cpointer (sexp ctx, sexp_uint_t type_id, void *value,
                         sexp parent, int freep) {
  sexp ptr;
  if (! value) return SEXP_FALSE;
  ptr = sexp_alloc_type(ctx, cpointer, type_id);
  if (sexp_exceptionp(ptr)) return ptr;
  sexp_freep(ptr) = freep;
  sexp_cpointer_value(ptr) = value;
  sexp_cpointer_parent(ptr) = parent;
  sexp_cpointer_length(ptr) = 0;
  return ptr;
}